

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Core.cpp
# Opt level: O0

void Rml::ReleaseFontResources(void)

{
  bool bVar1;
  CoreData *pCVar2;
  Element *this;
  reference ppVar3;
  pointer pCVar4;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::Context,_Rml::Releaser<Rml::Context>_>_>
  *name_context_1;
  iterator __end1_1;
  iterator __begin1_1;
  UnorderedMap<String,_ContextPtr> *__range1_1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::Context,_Rml::Releaser<Rml::Context>_>_>
  *name_context;
  iterator __end1;
  iterator __begin1;
  UnorderedMap<String,_ContextPtr> *__range1;
  
  if (font_interface != (long *)0x0) {
    pCVar2 = ControlledLifetimeResource<Rml::CoreData>::operator->
                       ((ControlledLifetimeResource<Rml::CoreData> *)core_data);
    join_0x00000010_0x00000000_ =
         robin_hood::detail::
         Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::Context,_Rml::Releaser<Rml::Context>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(&pCVar2->contexts);
    _name_context =
         robin_hood::detail::
         Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::Context,_Rml::Releaser<Rml::Context>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&pCVar2->contexts);
    while (bVar1 = robin_hood::detail::
                   Table<true,80ul,std::__cxx11::string,std::unique_ptr<Rml::Context,Rml::Releaser<Rml::Context>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                   ::Iter<false>::operator!=
                             ((Iter<false> *)&__end1.mInfo,(Iter<false> *)&name_context), bVar1) {
      ppVar3 = robin_hood::detail::
               Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::Context,_Rml::Releaser<Rml::Context>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::Iter<false>::operator*((Iter<false> *)&__end1.mInfo);
      pCVar4 = ::std::unique_ptr<Rml::Context,_Rml::Releaser<Rml::Context>_>::operator->
                         (&ppVar3->second);
      this = Context::GetRootElement(pCVar4);
      Element::DirtyFontFaceRecursive(this);
      robin_hood::detail::
      Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::Context,_Rml::Releaser<Rml::Context>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::Iter<false>::operator++((Iter<false> *)&__end1.mInfo);
    }
    (**(code **)(*font_interface + 0x60))();
    pCVar2 = ControlledLifetimeResource<Rml::CoreData>::operator->
                       ((ControlledLifetimeResource<Rml::CoreData> *)core_data);
    join_0x00000010_0x00000000_ =
         robin_hood::detail::
         Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::Context,_Rml::Releaser<Rml::Context>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(&pCVar2->contexts);
    _name_context_1 =
         robin_hood::detail::
         Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::Context,_Rml::Releaser<Rml::Context>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&pCVar2->contexts);
    while (bVar1 = robin_hood::detail::
                   Table<true,80ul,std::__cxx11::string,std::unique_ptr<Rml::Context,Rml::Releaser<Rml::Context>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                   ::Iter<false>::operator!=
                             ((Iter<false> *)&__end1_1.mInfo,(Iter<false> *)&name_context_1), bVar1)
    {
      ppVar3 = robin_hood::detail::
               Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::Context,_Rml::Releaser<Rml::Context>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::Iter<false>::operator*((Iter<false> *)&__end1_1.mInfo);
      pCVar4 = ::std::unique_ptr<Rml::Context,_Rml::Releaser<Rml::Context>_>::operator->
                         (&ppVar3->second);
      Context::Update(pCVar4);
      robin_hood::detail::
      Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::Context,_Rml::Releaser<Rml::Context>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::Iter<false>::operator++((Iter<false> *)&__end1_1.mInfo);
    }
  }
  return;
}

Assistant:

void ReleaseFontResources()
{
	if (!font_interface)
		return;

	for (const auto& name_context : core_data->contexts)
		name_context.second->GetRootElement()->DirtyFontFaceRecursive();

	font_interface->ReleaseFontResources();

	for (const auto& name_context : core_data->contexts)
		name_context.second->Update();
}